

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.cpp
# Opt level: O2

size_t __thiscall
pstore::repo::debug_line_section_creation_dispatcher::size_bytes
          (debug_line_section_creation_dispatcher *this)

{
  section_content *psVar1;
  size_t sVar2;
  sources<std::pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
  local_30;
  
  psVar1 = this->section_;
  local_30.data_range.first.pos_ = (psVar1->data).buffer_;
  local_30.data_range.second.pos_ = local_30.data_range.first.pos_ + (psVar1->data).elements_;
  local_30.ifixups_range.first._M_current =
       (psVar1->ifixups).
       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.ifixups_range.second._M_current =
       (psVar1->ifixups).
       super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.xfixups_range.first._M_current =
       (psVar1->xfixups).
       super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.xfixups_range.second._M_current =
       (psVar1->xfixups).
       super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = debug_line_section::
          size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                    (&local_30);
  return sVar2;
}

Assistant:

std::size_t debug_line_section_creation_dispatcher::size_bytes () const {
            return debug_line_section::size_bytes (section_->make_sources ());
        }